

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_GetThisScoped
              (FrameDisplay *pScope,Var defaultInstance,ScriptContext *scriptContext)

{
  uint16 uVar1;
  BOOL BVar2;
  void *aValue;
  RecyclableObject *instance;
  RecyclableObject *obj;
  Var value;
  int i;
  int length;
  ScriptContext *scriptContext_local;
  Var defaultInstance_local;
  FrameDisplay *pScope_local;
  
  _i = scriptContext;
  scriptContext_local = (ScriptContext *)defaultInstance;
  defaultInstance_local = pScope;
  uVar1 = FrameDisplay::GetLength(pScope);
  value._4_4_ = (uint)uVar1;
  value._0_4_ = 0;
  while( true ) {
    if ((int)value._4_4_ <= (int)(uint)value) {
      return scriptContext_local;
    }
    obj = (RecyclableObject *)0x0;
    aValue = FrameDisplay::GetItem((FrameDisplay *)defaultInstance_local,(uint)value);
    instance = VarTo<Js::RecyclableObject>(aValue);
    BVar2 = GetProperty(instance,0x2d5,&obj,_i,(PropertyValueInfo *)0x0);
    if (BVar2 != 0) break;
    value._0_4_ = (uint)value + 1;
  }
  return obj;
}

Assistant:

Var JavascriptOperators::OP_GetThisScoped(FrameDisplay *pScope, Var defaultInstance, ScriptContext* scriptContext)
    {
        // NOTE: If changes are made to this logic be sure to update the debuggers as well
        int length = pScope->GetLength();

        for (int i = 0; i < length; i += 1)
        {
            Var value = nullptr;
            RecyclableObject *obj = VarTo<RecyclableObject>(pScope->GetItem(i));
            if (JavascriptOperators::GetProperty(obj, Js::PropertyIds::_this, &value, scriptContext))
            {
                return value;
            }
        }

        return defaultInstance;
    }